

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t driver::zesFanGetProperties(zes_fan_handle_t hFan,zes_fan_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010ed20 != (code *)0x0) {
    zVar1 = (*DAT_0010ed20)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanGetProperties(
        zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
        zes_fan_properties_t* pProperties               ///< [in,out] Will contain the properties of the fan.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProperties = context.zesDdiTable.Fan.pfnGetProperties;
        if( nullptr != pfnGetProperties )
        {
            result = pfnGetProperties( hFan, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }